

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

double house_2(double *x,int N,double *v)

{
  double dVar1;
  double *C;
  double *__ptr;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  C = (double *)malloc(8);
  __ptr = (double *)malloc((long)N * 8);
  mmult(x,x,C,1,N,1);
  dVar3 = *C;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  *C = dVar3;
  *__ptr = 1.0;
  if (1 < N) {
    memset(__ptr + 1,0,(ulong)(N - 1) << 3);
  }
  dVar1 = *x;
  dVar4 = 1.0;
  if (dVar1 <= 0.0) {
    if (0.0 <= dVar1) {
      if ((dVar1 == 0.0) && (!NAN(dVar1))) {
        dVar4 = 0.0;
      }
    }
    else {
      dVar4 = -1.0;
    }
  }
  *__ptr = dVar3 * dVar4;
  if (0 < N) {
    uVar2 = 0;
    do {
      v[uVar2] = __ptr[uVar2] + x[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  mmult(v,v,C,1,N,1);
  dVar3 = *C;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  *C = dVar3;
  if (0 < N) {
    uVar2 = 0;
    do {
      v[uVar2] = v[uVar2] / dVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  free(C);
  free(__ptr);
  return 2.0;
}

Assistant:

double house_2(double*x,int N,double *v) {
	double sgn,beta,sc;
	double *sigma,*e;
	int i;
	
	sigma = (double*) malloc(sizeof(double) * 1);
	e = (double*) malloc(sizeof(double) * N);
	
	beta = 2.0;
	sgn = 1.0;
	mmult(x,x,sigma,1,N,1);
	sigma[0] = sqrt(sigma[0]);
	
	e[0] =1.;
	for (i = 1; i < N;++i) {
		e[i] = 0.;
	}
	
	if (x[0] > 0.) {
		sgn = 1.0;
	} else if (x[0] < 0.) {
		sgn = -1.0;
	} else if (x[0] == 0.) {
		sgn = 0.;
	}
	
	sc = sigma[0] * sgn;
	
	//scale(e,N,1,sc);
	
	e[0] *= sc;
	
	for(i = 0; i < N;++i) {
		v[i] = e[i] + x[i];
	}
	
	mmult(v,v,sigma,1,N,1);
	sigma[0] = sqrt(sigma[0]);
	
	for(i = 0; i < N;++i) {
		v[i] = v[i] / sigma[0];
	}
	
	free(sigma);
	free(e);
	return beta;
}